

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::checkForCustomUnit(string *unit_string)

{
  char cVar1;
  char *pcVar2;
  precise_unit pVar3;
  precise_unit pVar4;
  precise_unit pVar5;
  bool bVar6;
  uint32_t uVar7;
  int iVar8;
  size_t sVar9;
  size_type __n;
  size_type sVar10;
  precise_unit pVar11;
  precise_unit pVar12;
  long lStack_80;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> csub;
  string local_40;
  
  pcVar2 = (unit_string->_M_dataplus)._M_p;
  pVar5.base_units_ = (unit_data)0xfa94a488;
  pVar5.commodity_ = 0;
  pVar5.multiplier_ = NAN;
  pVar4.base_units_ = (unit_data)0xfa94a488;
  pVar4.commodity_ = 0;
  pVar4.multiplier_ = NAN;
  pVar12.base_units_ = (unit_data)0xfa94a488;
  pVar12.commodity_ = 0;
  pVar12.multiplier_ = NAN;
  pVar3.base_units_ = (unit_data)0xfa94a488;
  pVar3.commodity_ = 0;
  pVar3.multiplier_ = NAN;
  pVar11.base_units_ = (unit_data)0xfa94a488;
  pVar11.commodity_ = 0;
  pVar11.multiplier_ = NAN;
  if (*pcVar2 == '{') {
    if (pcVar2[unit_string->_M_string_length - 1] != '}') {
      return pVar5;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&csub,"\'u}",&local_69);
    bVar6 = ends_with(unit_string,&csub);
    std::__cxx11::string::~string((string *)&csub);
    if (bVar6) {
      lStack_80 = -3;
      goto LAB_0033e70d;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&csub,"index}",&local_69);
    bVar6 = ends_with(unit_string,&csub);
  }
  else {
    if (*pcVar2 != '[') {
      return pVar11;
    }
    if (pcVar2[unit_string->_M_string_length - 1] != ']') {
      return pVar3;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&csub,"U]",&local_69);
    bVar6 = ends_with(unit_string,&csub);
    std::__cxx11::string::~string((string *)&csub);
    if (bVar6) {
      lStack_80 = -2;
LAB_0033e70d:
      bVar6 = false;
      goto LAB_0033e775;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&csub,"index]",&local_69);
    bVar6 = ends_with(unit_string,&csub);
  }
  std::__cxx11::string::~string((string *)&csub);
  if (bVar6 == false) {
    return pVar4;
  }
  bVar6 = true;
  lStack_80 = -6;
LAB_0033e775:
  lStack_80 = lStack_80 + unit_string->_M_string_length;
  if (lStack_80 != -1) {
    cVar1 = (unit_string->_M_dataplus)._M_p[lStack_80 + -1];
    if ((cVar1 == '_') || (cVar1 == '\'')) {
      __n = lStack_80 - 2;
    }
    else {
      __n = lStack_80 - 1;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&csub,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,1,
               __n);
    if (bVar6) {
      std::__cxx11::string::string
                ((string *)&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&csub);
      uVar7 = getCommodity(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      pVar11 = precise::generate_custom_count_unit(0);
      pVar12.commodity_ = uVar7 | pVar11.commodity_;
      pVar12.base_units_ = pVar11.base_units_;
      pVar12.multiplier_ = pVar11.multiplier_;
    }
    else {
      for (sVar10 = 0; csub._M_string_length != sVar10; sVar10 = sVar10 + 1) {
        iVar8 = tolower((int)csub._M_dataplus._M_p[sVar10]);
        csub._M_dataplus._M_p[sVar10] = (char)iVar8;
      }
      sVar9 = CLI::std::
              hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_69,(string *)&csub);
      pVar12 = precise::generate_custom_unit((ushort)sVar9 & 0x3f);
    }
    std::__cxx11::string::~string((string *)&csub);
  }
  return pVar12;
}

Assistant:

static precise_unit checkForCustomUnit(const std::string& unit_string)
{
    size_t loc = std::string::npos;
    bool index = false;
    if (unit_string.front() == '[' && unit_string.back() == ']') {
        if (ends_with(unit_string, "U]")) {
            loc = unit_string.size() - 2;
        } else if (ends_with(unit_string, "index]")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    } else if (unit_string.front() == '{' && unit_string.back() == '}') {
        if (ends_with(unit_string, "'u}")) {
            loc = unit_string.size() - 3;
        } else if (ends_with(unit_string, "index}")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    }
    if (loc != std::string::npos) {
        if ((unit_string[loc - 1] == '\'') || (unit_string[loc - 1] == '_')) {
            --loc;
        }
        auto csub = unit_string.substr(1, loc - 1);

        if (index) {
            auto hcode = getCommodity(csub);
            return {1.0, precise::generate_custom_count_unit(0), hcode};
        }

        std::transform(csub.begin(), csub.end(), csub.begin(), ::tolower);
        auto custcode = std::hash<std::string>{}(csub);
        return precise::generate_custom_unit(custcode & 0x3FU);
    }

    return precise::invalid;
}